

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_debug_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  uint32_t uVar1;
  FILE *pFVar2;
  
  read_debug_rbsp_trailing_bits(b);
  if (h->pps->entropy_coding_mode_flag != 0) {
    while (b->p < b->end) {
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u(b,0x10);
      pFVar2 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar2 = _stdout;
      }
      fprintf(pFVar2,"cabac_zero_word: %d \n",(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void read_debug_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    read_debug_rbsp_trailing_bits(b);
    if( h->pps->entropy_coding_mode_flag )
    {
        while( more_rbsp_trailing_data(h, b) )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); int cabac_zero_word = bs_read_u(b, 16); printf("cabac_zero_word: %d \n", cabac_zero_word); 
        }
    }
}